

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::surroundingNodes(BoxList *this,int dir)

{
  bool bVar1;
  int in_ESI;
  BoxList *in_RDI;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_ffffffffffffff58;
  reference in_stack_ffffffffffffff60;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_80 [2];
  int local_6c;
  int local_5c;
  reference local_58;
  int local_4c;
  IndexType *local_48;
  int local_3c;
  IndexType *local_38;
  int local_2c;
  undefined4 local_28;
  int local_24;
  IntVect *local_20;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  local_6c = in_ESI;
  local_80[0]._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin(in_stack_ffffffffffffff58)
  ;
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    in_stack_ffffffffffffff60 =
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*(local_80);
    local_5c = local_6c;
    local_48 = &in_stack_ffffffffffffff60->btype;
    local_4c = local_6c;
    local_3c = local_6c;
    local_2c = local_6c;
    if ((local_48->itype & 1 << ((byte)local_6c & 0x1f)) == 0) {
      local_20 = &in_stack_ffffffffffffff60->bigend;
      local_24 = local_6c;
      local_28 = 1;
      local_20->vect[local_6c] = local_20->vect[local_6c] + 1;
      local_10 = &in_stack_ffffffffffffff60->btype;
      local_14 = local_6c;
      local_4 = local_6c;
      local_10->itype = 1 << ((byte)local_6c & 0x1f) | local_10->itype;
    }
    local_58 = in_stack_ffffffffffffff60;
    local_38 = local_48;
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_80);
  }
  return in_RDI;
}

Assistant:

BoxList&
BoxList::surroundingNodes (int dir) noexcept
{
    for (auto& bx : m_lbox)
    {
        bx.surroundingNodes(dir);
    }
    return *this;
}